

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O1

void __thiscall hwnet::Buffer::Append(Buffer *this,char *ptr,size_t l)

{
  ulong uVar1;
  ulong local_50;
  size_t cap_;
  Ptr newbuff;
  
  if ((l != 0 && ptr != (char *)0x0) && (uVar1 = this->len + l, !CARRY8(this->len,l))) {
    if (this->cap < uVar1) {
      cap_ = 0;
      local_50 = uVar1;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<hwnet::Buffer::bytes,std::allocator<hwnet::Buffer::bytes>,unsigned_long&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&newbuff,(bytes **)&cap_,
                 (allocator<hwnet::Buffer::bytes> *)
                 ((long)&newbuff.
                         super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 7),&local_50);
      memcpy(*(void **)cap_,
             ((this->buff).super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->ptr + this->b,this->len);
      this->cap = local_50;
      (this->buff).super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)cap_;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->buff).super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)&newbuff);
      this->b = 0;
      if (newbuff.super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   newbuff.super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
    }
    memcpy(((this->buff).super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           )->ptr + this->b + this->len,ptr,l);
    this->len = this->len + l;
  }
  return;
}

Assistant:

void Append(const char *ptr,size_t l) {
		if(ptr && l > 0) {
			auto need = this->len + l;
			if(need < this->len) {
				//overflow
				return;
			}

			if(need > this->cap) {
				//扩容
				size_t cap_ = need;
				bytes::Ptr newbuff = std::make_shared<bytes>(cap_);
				memcpy(newbuff->ptr,this->buff->ptr + this->b,this->len);
				this->cap = cap_;
				this->buff = newbuff;
				this->b = 0;
			}
			memcpy(this->buff->ptr + this->len + this->b , ptr , l);
			this->len += l;			
		}
	}